

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O0

HTTPAPIEX_RESULT
HTTPAPIEX_ExecuteRequest
          (HTTPAPIEX_HANDLE handle,HTTPAPI_REQUEST_TYPE requestType,char *relativePath,
          HTTP_HEADERS_HANDLE requestHttpHeadersHandle,BUFFER_HANDLE requestContent,uint *statusCode
          ,HTTP_HEADERS_HANDLE responseHttpHeadersHandle,BUFFER_HANDLE responseContent)

{
  _Bool _Var1;
  int iVar2;
  HTTPAPI_RESULT HVar3;
  LOGGER_LOG p_Var4;
  char *pcVar5;
  HTTPAPIEX_HANDLE_DATA *pHVar6;
  HTTP_HANDLE pHVar7;
  undefined8 *puVar8;
  size_t sVar9;
  uchar *content;
  undefined8 in_stack_fffffffffffffe48;
  undefined4 uVar10;
  HTTP_HEADERS_HANDLE *toBeUsedRelativePath_00;
  LOGGER_LOG l_4;
  uchar *buffer;
  size_t length;
  LOGGER_LOG l_3;
  HTTPAPIEX_SAVED_OPTION *option;
  size_t vectorSize;
  size_t i;
  _Bool goOn;
  LOGGER_LOG p_Stack_d8;
  _Bool st [3];
  LOGGER_LOG l_2;
  BUFFER_HANDLE pBStack_c8;
  _Bool isOriginalResponseContent;
  BUFFER_HANDLE toBeUsedResponseContent;
  HTTP_HEADERS_HANDLE pHStack_b8;
  _Bool isOriginalResponseHttpHeadersHandle;
  HTTP_HEADERS_HANDLE toBeUsedResponseHttpHeadersHandle;
  uint *toBeUsedStatusCode;
  BUFFER_HANDLE pBStack_a0;
  _Bool isOriginalRequestContent;
  BUFFER_HANDLE toBeUsedRequestContent;
  HTTP_HEADERS_HANDLE pHStack_90;
  _Bool isOriginalRequestHttpHeadersHandle;
  HTTP_HEADERS_HANDLE toBeUsedRequestHttpHeadersHandle;
  char *toBeUsedRelativePath;
  HTTPAPIEX_HANDLE_DATA *handleData;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  uint *puStack_60;
  HTTPAPIEX_RESULT result;
  uint *statusCode_local;
  BUFFER_HANDLE requestContent_local;
  HTTP_HEADERS_HANDLE requestHttpHeadersHandle_local;
  char *relativePath_local;
  HTTPAPIEX_HANDLE pHStack_38;
  HTTPAPI_REQUEST_TYPE requestType_local;
  HTTPAPIEX_HANDLE handle_local;
  
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  puStack_60 = statusCode;
  statusCode_local = (uint *)requestContent;
  requestContent_local = (BUFFER_HANDLE)requestHttpHeadersHandle;
  requestHttpHeadersHandle_local = (HTTP_HEADERS_HANDLE)relativePath;
  relativePath_local._4_4_ = requestType;
  pHStack_38 = handle;
  if (handle == (HTTPAPIEX_HANDLE)0x0) {
    l._4_4_ = HTTPAPIEX_INVALID_ARG;
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      l_1 = p_Var4;
      pcVar5 = HTTPAPIEX_RESULTStrings(l._4_4_);
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpapiex.c"
                ,"HTTPAPIEX_ExecuteRequest",0x175,1,"error code = %s%s (%d)","",pcVar5,
                CONCAT44(uVar10,l._4_4_));
    }
  }
  else {
    _Var1 = validRequestType(requestType);
    if (_Var1) {
      toBeUsedRelativePath = (char *)pHStack_38;
      toBeUsedRelativePath_00 = &toBeUsedRequestHttpHeadersHandle;
      iVar2 = buildAllRequests(pHStack_38,relativePath_local._4_4_,
                               (char *)requestHttpHeadersHandle_local,
                               (HTTP_HEADERS_HANDLE)requestContent_local,
                               (BUFFER_HANDLE)statusCode_local,puStack_60,responseHttpHeadersHandle,
                               responseContent,(char **)toBeUsedRelativePath_00,
                               &stack0xffffffffffffff70,(_Bool *)((long)&toBeUsedRequestContent + 7)
                               ,&stack0xffffffffffffff60,(_Bool *)((long)&toBeUsedStatusCode + 7),
                               (uint **)&toBeUsedResponseHttpHeadersHandle,&stack0xffffffffffffff48,
                               (_Bool *)((long)&toBeUsedResponseContent + 7),
                               &stack0xffffffffffffff38,(_Bool *)((long)&l_2 + 7));
      uVar10 = (undefined4)((ulong)toBeUsedRelativePath_00 >> 0x20);
      if (iVar2 == 0) {
        memset((void *)((long)&i + 5),0,3);
        if (*(int *)(toBeUsedRelativePath + 8) == -1) {
          toBeUsedRelativePath[8] = '\0';
          toBeUsedRelativePath[9] = '\0';
          toBeUsedRelativePath[10] = '\0';
          toBeUsedRelativePath[0xb] = '\0';
        }
        do {
          if (2 < *(int *)(toBeUsedRelativePath + 8)) break;
          if ((*(byte *)((long)&i + (long)*(int *)(toBeUsedRelativePath + 8) + 5) & 1) == 1) {
            i._4_1_ = false;
          }
          else {
            iVar2 = *(int *)(toBeUsedRelativePath + 8);
            if (iVar2 == 0) {
              if (useGlobalInitialization < 1) {
                HVar3 = HTTPAPI_Init();
                i._4_1_ = HVar3 == HTTPAPI_OK;
              }
              else {
                i._4_1_ = true;
              }
            }
            else if (iVar2 == 1) {
              pcVar5 = STRING_c_str(*(STRING_HANDLE *)toBeUsedRelativePath);
              pHVar7 = HTTPAPI_CreateConnection(pcVar5);
              *(HTTP_HANDLE *)(toBeUsedRelativePath + 0x10) = pHVar7;
              if (pHVar7 == (HTTP_HANDLE)0x0) {
                i._4_1_ = false;
              }
              else {
                sVar9 = VECTOR_size(*(VECTOR_HANDLE *)(toBeUsedRelativePath + 0x18));
                for (vectorSize = 0; vectorSize < sVar9; vectorSize = vectorSize + 1) {
                  puVar8 = (undefined8 *)
                           VECTOR_element(*(VECTOR_HANDLE *)(toBeUsedRelativePath + 0x18),vectorSize
                                         );
                  HVar3 = HTTPAPI_SetOption(*(HTTP_HANDLE *)(toBeUsedRelativePath + 0x10),
                                            (char *)*puVar8,(void *)puVar8[1]);
                  if ((HVar3 != HTTPAPI_OK) &&
                     (p_Var4 = xlogging_get_log_function(), p_Var4 != (LOGGER_LOG)0x0)) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpapiex.c"
                              ,"HTTPAPIEX_ExecuteRequest",0x1d8,1,
                              "HTTPAPI_SetOption failed when called for option %s",*puVar8);
                  }
                }
                i._4_1_ = true;
              }
            }
            else if (iVar2 == 2) {
              sVar9 = BUFFER_length(pBStack_a0);
              content = BUFFER_u_char(pBStack_a0);
              HVar3 = HTTPAPI_ExecuteRequest
                                (*(HTTP_HANDLE *)(toBeUsedRelativePath + 0x10),
                                 relativePath_local._4_4_,(char *)toBeUsedRequestHttpHeadersHandle,
                                 pHStack_90,content,sVar9,(uint *)toBeUsedResponseHttpHeadersHandle,
                                 pHStack_b8,pBStack_c8);
              i._4_1_ = HVar3 == HTTPAPI_OK;
            }
            else {
              i._4_1_ = false;
            }
          }
          if ((bool)i._4_1_ == false) {
            *(undefined1 *)((long)&i + (long)*(int *)(toBeUsedRelativePath + 8) + 5) = 0;
            *(int *)(toBeUsedRelativePath + 8) = *(int *)(toBeUsedRelativePath + 8) + -1;
            if (*(int *)(toBeUsedRelativePath + 8) == 0) {
              if (useGlobalInitialization == 0) {
                HTTPAPI_Deinit();
              }
            }
            else if (*(int *)(toBeUsedRelativePath + 8) == 1) {
              HTTPAPI_CloseConnection(*(HTTP_HANDLE *)(toBeUsedRelativePath + 0x10));
              toBeUsedRelativePath[0x10] = '\0';
              toBeUsedRelativePath[0x11] = '\0';
              toBeUsedRelativePath[0x12] = '\0';
              toBeUsedRelativePath[0x13] = '\0';
              toBeUsedRelativePath[0x14] = '\0';
              toBeUsedRelativePath[0x15] = '\0';
              toBeUsedRelativePath[0x16] = '\0';
              toBeUsedRelativePath[0x17] = '\0';
            }
          }
          else {
            if (*(int *)(toBeUsedRelativePath + 8) == 2) {
              l._4_4_ = HTTPAPIEX_OK;
              goto LAB_0010903d;
            }
            *(undefined1 *)((long)&i + (long)*(int *)(toBeUsedRelativePath + 8) + 5) = 1;
            *(int *)(toBeUsedRelativePath + 8) = *(int *)(toBeUsedRelativePath + 8) + 1;
            *(undefined1 *)((long)&i + (long)*(int *)(toBeUsedRelativePath + 8) + 5) = 0;
          }
        } while (-1 < *(int *)(toBeUsedRelativePath + 8));
        l._4_4_ = HTTPAPIEX_RECOVERYFAILED;
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpapiex.c"
                    ,"HTTPAPIEX_ExecuteRequest",0x227,1,
                    "unable to recover sending to a working state");
        }
LAB_0010903d:
        if ((toBeUsedStatusCode._7_1_ & 1) == 0) {
          BUFFER_delete(pBStack_a0);
          pBStack_a0 = (BUFFER_HANDLE)0x0;
        }
        if ((toBeUsedRequestContent._7_1_ & 1) == 0) {
          HTTPHeaders_Free(pHStack_90);
          pHStack_90 = (HTTP_HEADERS_HANDLE)0x0;
        }
        if ((l_2._7_1_ & 1) == 0) {
          BUFFER_delete(pBStack_c8);
          pBStack_c8 = (BUFFER_HANDLE)0x0;
        }
        if ((toBeUsedResponseContent._7_1_ & 1) == 0) {
          HTTPHeaders_Free(pHStack_b8);
        }
      }
      else {
        l._4_4_ = HTTPAPIEX_ERROR;
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          p_Stack_d8 = p_Var4;
          pcVar5 = HTTPAPIEX_RESULTStrings(l._4_4_);
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpapiex.c"
                    ,"HTTPAPIEX_ExecuteRequest",0x194,1,"error code = %s%s (%d)","",pcVar5,
                    CONCAT44(uVar10,l._4_4_));
        }
      }
    }
    else {
      l._4_4_ = HTTPAPIEX_INVALID_ARG;
      pHVar6 = (HTTPAPIEX_HANDLE_DATA *)xlogging_get_log_function();
      if (pHVar6 != (HTTPAPIEX_HANDLE_DATA *)0x0) {
        handleData = pHVar6;
        pcVar5 = HTTPAPIEX_RESULTStrings(l._4_4_);
        (*(code *)pHVar6)(0,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/httpapiex.c"
                          ,"HTTPAPIEX_ExecuteRequest",0x17d,1,"error code = %s%s (%d)","",pcVar5,
                          CONCAT44(uVar10,l._4_4_));
      }
    }
  }
  return l._4_4_;
}

Assistant:

HTTPAPIEX_RESULT HTTPAPIEX_ExecuteRequest(HTTPAPIEX_HANDLE handle, HTTPAPI_REQUEST_TYPE requestType, const char* relativePath,
    HTTP_HEADERS_HANDLE requestHttpHeadersHandle, BUFFER_HANDLE requestContent, unsigned int* statusCode,
    HTTP_HEADERS_HANDLE responseHttpHeadersHandle, BUFFER_HANDLE responseContent)
{
    HTTPAPIEX_RESULT result;
    /*Codes_SRS_HTTPAPIEX_02_006: [If parameter handle is NULL then HTTPAPIEX_ExecuteRequest shall fail and return HTTPAPIEX_INVALID_ARG.]*/
    if (handle == NULL)
    {
        result = HTTPAPIEX_INVALID_ARG;
        LOG_HTTAPIEX_ERROR();
    }
    else
    {
        /*Codes_SRS_HTTPAPIEX_02_007: [If parameter requestType does not indicate a valid request, HTTPAPIEX_ExecuteRequest shall fail and return HTTPAPIEX_INVALID_ARG.] */
        if (!validRequestType(requestType))
        {
            result = HTTPAPIEX_INVALID_ARG;
            LOG_HTTAPIEX_ERROR();
        }
        else
        {
            HTTPAPIEX_HANDLE_DATA *handleData = (HTTPAPIEX_HANDLE_DATA *)handle;

            /*call to buildAll*/
            const char* toBeUsedRelativePath;
            HTTP_HEADERS_HANDLE toBeUsedRequestHttpHeadersHandle; bool isOriginalRequestHttpHeadersHandle;
            BUFFER_HANDLE toBeUsedRequestContent; bool isOriginalRequestContent;
            unsigned int* toBeUsedStatusCode;
            HTTP_HEADERS_HANDLE toBeUsedResponseHttpHeadersHandle; bool isOriginalResponseHttpHeadersHandle;
            BUFFER_HANDLE toBeUsedResponseContent;  bool isOriginalResponseContent;

            if (buildAllRequests(handleData, requestType, relativePath, requestHttpHeadersHandle, requestContent, statusCode, responseHttpHeadersHandle, responseContent,
                &toBeUsedRelativePath,
                &toBeUsedRequestHttpHeadersHandle, &isOriginalRequestHttpHeadersHandle,
                &toBeUsedRequestContent, &isOriginalRequestContent,
                &toBeUsedStatusCode,
                &toBeUsedResponseHttpHeadersHandle, &isOriginalResponseHttpHeadersHandle,
                &toBeUsedResponseContent, &isOriginalResponseContent) != 0)
            {
                result = HTTPAPIEX_ERROR;
                LOG_HTTAPIEX_ERROR();
            }
            else
            {

                /*Codes_SRS_HTTPAPIEX_02_023: [HTTPAPIEX_ExecuteRequest shall try to execute the HTTP call by ensuring the following API call sequence is respected:]*/
                /*Codes_SRS_HTTPAPIEX_02_024: [If any point in the sequence fails, HTTPAPIEX_ExecuteRequest shall attempt to recover by going back to the previous step and retrying that step.]*/
                /*Codes_SRS_HTTPAPIEX_02_025: [If the first step fails, then the sequence fails.]*/
                /*Codes_SRS_HTTPAPIEX_02_026: [A step shall be retried at most once.]*/
                /*Codes_SRS_HTTPAPIEX_02_027: [If a step has been retried then all subsequent steps shall be retried too.]*/
                bool st[3] = { false, false, false }; /*the three levels of possible failure in resilient send: HTTAPI_Init, HTTPAPI_CreateConnection, HTTPAPI_ExecuteRequest*/
                if (handleData->k == -1)
                {
                    handleData->k = 0;
                }

                do
                {
                    bool goOn;

                    if (handleData->k > 2)
                    {
                        /* error */
                        break;
                    }

                    if (st[handleData->k] == true) /*already been tried*/
                    {
                        goOn = false;
                    }
                    else
                    {
                        switch (handleData->k)
                        {
                        case 0:
                        {
                            if (useGlobalInitialization > 0)
                            {
                                /*Codes_SRS_HTTPAPIEX_21_048: [If HTTPAPIEX_Init was called, HTTPAPI_ExecuteRequest shall not call HTTPAPI_Init.] */
                                goOn = true;
                            }
                            else if (HTTPAPI_Init() != HTTPAPI_OK)
                            {
                                goOn = false;
                            }
                            else
                            {
                                goOn = true;
                            }
                            break;
                        }
                        case 1:
                        {
                            if ((handleData->httpHandle = HTTPAPI_CreateConnection(STRING_c_str(handleData->hostName))) == NULL)
                            {
                                goOn = false;
                            }
                            else
                            {
                                size_t i;
                                size_t vectorSize = VECTOR_size(handleData->savedOptions);
                                for (i = 0; i < vectorSize; i++)
                                {
                                    /*Codes_SRS_HTTPAPIEX_02_035: [HTTPAPIEX_ExecuteRequest shall pass all the saved options (see HTTPAPIEX_SetOption) to the newly create HTTPAPI_HANDLE in step 2 by calling HTTPAPI_SetOption.]*/
                                    /*Codes_SRS_HTTPAPIEX_02_036: [If setting the option fails, then the failure shall be ignored.] */
                                    HTTPAPIEX_SAVED_OPTION* option = (HTTPAPIEX_SAVED_OPTION*)VECTOR_element(handleData->savedOptions, i);
                                    if (HTTPAPI_SetOption(handleData->httpHandle, option->optionName, option->value) != HTTPAPI_OK)
                                    {
                                        LogError("HTTPAPI_SetOption failed when called for option %s", option->optionName);
                                    }
                                }
                                goOn = true;
                            }
                            break;
                        }
                        case 2:
                        {
                            size_t length = BUFFER_length(toBeUsedRequestContent);
                            unsigned char* buffer = BUFFER_u_char(toBeUsedRequestContent);
                            if (HTTPAPI_ExecuteRequest(handleData->httpHandle, requestType, toBeUsedRelativePath, toBeUsedRequestHttpHeadersHandle, buffer, length, toBeUsedStatusCode, toBeUsedResponseHttpHeadersHandle, toBeUsedResponseContent) != HTTPAPI_OK)
                            {
                                goOn = false;
                            }
                            else
                            {
                                goOn = true;
                            }
                            break;
                        }
                        default:
                        {
                            /*serious error*/
                            goOn = false;
                            break;
                        }
                        }
                    }

                    if (goOn)
                    {
                        if (handleData->k == 2)
                        {
                            /*Codes_SRS_HTTPAPIEX_02_028: [HTTPAPIEX_ExecuteRequest shall return HTTPAPIEX_OK when a call to HTTPAPI_ExecuteRequest has been completed successfully.]*/
                            result = HTTPAPIEX_OK;
                            goto out;
                        }
                        else
                        {
                            st[handleData->k] = true;
                            handleData->k++;
                            st[handleData->k] = false;
                        }
                    }
                    else
                    {
                        st[handleData->k] = false;
                        handleData->k--;
                        switch (handleData->k)
                        {
                        case 0:
                        {
                            /*Codes_SRS_HTTPAPIEX_21_049: [If HTTPAPIEX_Init was called, HTTPAPI_ExecuteRequest shall not call HTTPAPI_Deinit.] */
                            if (useGlobalInitialization == 0)
                            {
                                HTTPAPI_Deinit();
                            }
                            break;
                        }
                        case 1:
                        {
                            HTTPAPI_CloseConnection(handleData->httpHandle);
                            handleData->httpHandle = NULL;
                            break;
                        }
                        case 2:
                        {
                            break;
                        }
                        default:
                        {
                            break;
                        }
                        }
                    }
                } while (handleData->k >= 0);
                /*Codes_SRS_HTTPAPIEX_02_029: [Otherwise, HTTAPIEX_ExecuteRequest shall return HTTPAPIEX_RECOVERYFAILED.] */
                result = HTTPAPIEX_RECOVERYFAILED;
                LogError("unable to recover sending to a working state");
            out:;
                /*in all cases, unbuild the temporaries*/
                if (isOriginalRequestContent == false)
                {
                    BUFFER_delete(toBeUsedRequestContent);
                    toBeUsedRequestContent = NULL;
                }
                if (isOriginalRequestHttpHeadersHandle == false)
                {
                    HTTPHeaders_Free(toBeUsedRequestHttpHeadersHandle);
                    toBeUsedRequestHttpHeadersHandle = NULL;
                }
                if (isOriginalResponseContent == false)
                {
                    BUFFER_delete(toBeUsedResponseContent);
                    toBeUsedResponseContent = NULL;
                }
                if (isOriginalResponseHttpHeadersHandle == false)
                {
                    HTTPHeaders_Free(toBeUsedResponseHttpHeadersHandle);
                    toBeUsedResponseHttpHeadersHandle = NULL;
                }
            }
        }
    }
    return result;
}